

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

QString * insydeFlashDeviceMapEntryTypeGuidToUString(QString *__return_storage_ptr__,EFI_GUID *guid)

{
  bool bVar1;
  char *ch;
  QByteArray baGuid;
  
  QByteArray::QByteArray(&baGuid,(char *)guid,0x10);
  bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_BOOT_FV_GUID);
  if (bVar1) {
    ch = "Boot Firmare Volume";
  }
  else {
    bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_BVDT_GUID);
    if (bVar1) {
      ch = "BIOS Version Data Table";
    }
    else {
      bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_EC_GUID);
      if (bVar1) {
        ch = "EC Firmware";
      }
      else {
        bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_FTW_BACKUP_GUID);
        if (bVar1) {
          ch = "FTW Backup";
        }
        else {
          bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_FTW_STATE_GUID);
          if (bVar1) {
            ch = "FTW State";
          }
          else {
            bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_FV_GUID);
            if (bVar1) {
              ch = "Firmare Volume";
            }
            else {
              bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_FLASH_DEVICE_MAP_GUID);
              if (bVar1) {
                ch = "Flash Device Map";
              }
              else {
                bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_LOGO_GUID);
                if (bVar1) {
                  ch = "Logo";
                }
                else {
                  bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_MICROCODE_GUID);
                  if (bVar1) {
                    ch = "Microcode";
                  }
                  else {
                    bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_MSDM_TABLE_GUID);
                    if (bVar1) {
                      ch = "MSDM Table";
                    }
                    else {
                      bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_MULTI_CONFIG_GUID);
                      if (bVar1) {
                        ch = "MultiConfig";
                      }
                      else {
                        bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_VAR_DEFAULT_GUID);
                        if (bVar1) {
                          ch = "Variable Defaults";
                        }
                        else {
                          bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_SMBIOS_UPDATE_GUID);
                          if (bVar1) {
                            ch = "SMBIOS Update";
                          }
                          else {
                            bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_VAR_GUID);
                            if (bVar1) {
                              ch = "Variables";
                            }
                            else {
                              bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_UNKNOWN_GUID);
                              if (bVar1) {
                                ch = "Unknown";
                              }
                              else {
                                bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_UNUSED_GUID);
                                if (bVar1) {
                                  ch = "Unused";
                                }
                                else {
                                  bVar1 = operator==(&baGuid,&
                                                  INSYDE_FLASH_MAP_REGION_USB_OPTION_ROM_GUID);
                                  if (bVar1) {
                                    ch = "USB Option ROM";
                                  }
                                  else {
                                    bVar1 = operator==(&baGuid,&INSYDE_FLASH_MAP_REGION_DXE_FV_GUID)
                                    ;
                                    if (bVar1) {
                                      ch = "DXE Firmare Volume";
                                    }
                                    else {
                                      bVar1 = operator==(&baGuid,&
                                                  INSYDE_FLASH_MAP_REGION_PEI_FV_GUID);
                                      if (bVar1) {
                                        ch = "PEI Firmare Volume";
                                      }
                                      else {
                                        bVar1 = operator==(&baGuid,&
                                                  INSYDE_FLASH_MAP_REGION_UNSIGNED_FV_GUID);
                                        if (!bVar1) {
                                          guidToUString(__return_storage_ptr__,guid,true);
                                          goto LAB_00149063;
                                        }
                                        ch = "Unsigned Firmare Volume";
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QString::QString(__return_storage_ptr__,ch);
LAB_00149063:
  QArrayDataPointer<char>::~QArrayDataPointer(&baGuid.d);
  return __return_storage_ptr__;
}

Assistant:

UString insydeFlashDeviceMapEntryTypeGuidToUString(const EFI_GUID & guid)
{
    const UByteArray baGuid((const char*)&guid, sizeof(EFI_GUID));
    if (baGuid == INSYDE_FLASH_MAP_REGION_BOOT_FV_GUID)          return UString("Boot Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_BVDT_GUID)             return UString("BIOS Version Data Table");
    if (baGuid == INSYDE_FLASH_MAP_REGION_EC_GUID)               return UString("EC Firmware");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FTW_BACKUP_GUID)       return UString("FTW Backup");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FTW_STATE_GUID)        return UString("FTW State");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FV_GUID)               return UString("Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FLASH_DEVICE_MAP_GUID) return UString("Flash Device Map");
    if (baGuid == INSYDE_FLASH_MAP_REGION_LOGO_GUID)             return UString("Logo");
    if (baGuid == INSYDE_FLASH_MAP_REGION_MICROCODE_GUID)        return UString("Microcode");
    if (baGuid == INSYDE_FLASH_MAP_REGION_MSDM_TABLE_GUID)       return UString("MSDM Table");
    if (baGuid == INSYDE_FLASH_MAP_REGION_MULTI_CONFIG_GUID)     return UString("MultiConfig");
    if (baGuid == INSYDE_FLASH_MAP_REGION_VAR_DEFAULT_GUID)      return UString("Variable Defaults");
    if (baGuid == INSYDE_FLASH_MAP_REGION_SMBIOS_UPDATE_GUID)    return UString("SMBIOS Update");
    if (baGuid == INSYDE_FLASH_MAP_REGION_VAR_GUID)              return UString("Variables");
    if (baGuid == INSYDE_FLASH_MAP_REGION_UNKNOWN_GUID)          return UString("Unknown");
    if (baGuid == INSYDE_FLASH_MAP_REGION_UNUSED_GUID)           return UString("Unused");
    if (baGuid == INSYDE_FLASH_MAP_REGION_USB_OPTION_ROM_GUID)   return UString("USB Option ROM");
    if (baGuid == INSYDE_FLASH_MAP_REGION_DXE_FV_GUID)           return UString("DXE Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_PEI_FV_GUID)           return UString("PEI Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_UNSIGNED_FV_GUID)      return UString("Unsigned Firmare Volume");
    return guidToUString(guid);
}